

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O3

MainFunc __thiscall kj::TestRunner::getMain(TestRunner *this)

{
  StringPtr extendedDescription;
  StringPtr helpText;
  Iface *pIVar1;
  Iface *pIVar2;
  MainBuilder *pMVar3;
  Iface *extraout_RDX;
  _func_int **in_RSI;
  MainFunc MVar4;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  StringPtr version;
  StringPtr briefDescription;
  StringPtr argumentTitle;
  StringPtr helpText_00;
  Function<kj::MainBuilder::Validity_()> local_b8;
  Function<kj::MainBuilder::Validity_()> local_a8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_98;
  MainBuilder local_88;
  char *local_78;
  undefined8 uStack_70;
  char *local_68;
  undefined8 uStack_60;
  OptionName local_58;
  undefined1 local_48;
  char *local_40;
  OptionName local_38;
  undefined1 local_28;
  char *local_20;
  
  local_68 = "";
  uStack_60 = 1;
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  version.content.size_ = 0x28;
  version.content.ptr = "KJ Test Runner (version not applicable)";
  briefDescription.content.size_ = 0x4b;
  briefDescription.content.ptr =
       "Run all tests that have been linked into the binary with this test runner.";
  MainBuilder::MainBuilder
            (&local_88,(ProcessContext *)*in_RSI,version,briefDescription,extendedDescription);
  local_38.isLong = false;
  local_38.field_1.shortName = 'f';
  local_28 = 1;
  local_20 = "filter";
  local_98.impl.ptr = (Iface *)operator_new(0x18);
  (local_98.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___001ba170;
  local_98.impl.ptr[1]._vptr_Iface = in_RSI;
  local_98.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::{lambda(auto:1&,(auto:2&&)...)#1},kj::TestRunner::getMain()::{lambda(auto:1&,(auto:2&&)...)#2}>>>
        ::instance;
  local_78 = 
  "Run only the specified test case(s). You may use a \'*\' wildcard in <file>. You may also omit any prefix of <file>\'s path; test from all matching files will run. You may specify multiple filters; any test matching at least one filter will run. <line> may be a range, e.g. \"100-500\"."
  ;
  uStack_70 = 0x11a;
  helpText.content.size_ = 0x11a;
  helpText.content.ptr =
       "Run only the specified test case(s). You may use a \'*\' wildcard in <file>. You may also omit any prefix of <file>\'s path; test from all matching files will run. You may specify multiple filters; any test matching at least one filter will run. <line> may be a range, e.g. \"100-500\"."
  ;
  names._M_len = 2;
  names._M_array = &local_38;
  argumentTitle.content.size_ = 0x10;
  argumentTitle.content.ptr = "<file>[:<line>]";
  pMVar3 = MainBuilder::addOptionWithArg(&local_88,names,&local_98,argumentTitle,helpText);
  local_58.isLong = false;
  local_58.field_1.shortName = 'l';
  local_48 = 1;
  local_40 = "list";
  local_a8.impl.ptr = (Iface *)operator_new(0x18);
  (local_a8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___001ba1e8;
  local_a8.impl.ptr[1]._vptr_Iface = in_RSI;
  local_a8.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::{lambda(auto:1&,(auto:2&&)...)#3},kj::TestRunner::getMain()::{lambda(auto:1&,(auto:2&&)...)#4}>>>
        ::instance;
  names_00._M_len = 2;
  names_00._M_array = &local_58;
  helpText_00.content.size_ = 0x7b;
  helpText_00.content.ptr =
       "List all test cases that would run, but don\'t run them. If --filter is specified then only the match tests will be listed."
  ;
  pMVar3 = MainBuilder::addOption(pMVar3,names_00,&local_a8,helpText_00);
  local_b8.impl.ptr = (Iface *)operator_new(0x18);
  (local_b8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___001ba260;
  local_b8.impl.ptr[1]._vptr_Iface = in_RSI;
  local_b8.impl.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<kj::TestRunner&,kj::TestRunner::getMain()::{lambda(auto:1&,(auto:2&&)...)#5},kj::TestRunner::getMain()::{lambda(auto:1&,(auto:2&&)...)#6}>>>
        ::instance;
  MainBuilder::callAfterParsing(pMVar3,&local_b8);
  MVar4 = MainBuilder::build((MainBuilder *)this);
  pIVar1 = local_b8.impl.ptr;
  if (local_b8.impl.ptr != (Iface *)0x0) {
    local_b8.impl.ptr = (Iface *)0x0;
    (**(local_b8.impl.disposer)->_vptr_Disposer)
              (local_b8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface,
               MVar4.impl.ptr);
  }
  pIVar1 = local_a8.impl.ptr;
  if (local_a8.impl.ptr != (Iface *)0x0) {
    local_a8.impl.ptr = (Iface *)0x0;
    (**(local_a8.impl.disposer)->_vptr_Disposer)
              (local_a8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar2 = local_98.impl.ptr;
  if (local_98.impl.ptr != (Iface *)0x0) {
    local_98.impl.ptr = (Iface *)0x0;
    (**(local_98.impl.disposer)->_vptr_Disposer)
              (local_98.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  MainBuilder::~MainBuilder(&local_88);
  MVar4.impl.ptr = extraout_RDX;
  MVar4.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar4.impl;
}

Assistant:

MainFunc getMain() {
    return MainBuilder(context, "KJ Test Runner (version not applicable)",
        "Run all tests that have been linked into the binary with this test runner.")
        .addOptionWithArg({'f', "filter"}, KJ_BIND_METHOD(*this, setFilter), "<file>[:<line>]",
            "Run only the specified test case(s). You may use a '*' wildcard in <file>. You may "
            "also omit any prefix of <file>'s path; test from all matching files will run. "
            "You may specify multiple filters; any test matching at least one filter will run. "
            "<line> may be a range, e.g. \"100-500\".")
        .addOption({'l', "list"}, KJ_BIND_METHOD(*this, setList),
            "List all test cases that would run, but don't run them. If --filter is specified "
            "then only the match tests will be listed.")
        .callAfterParsing(KJ_BIND_METHOD(*this, run))
        .build();
  }